

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

void __thiscall
gmlc::containers::StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::
freeAll(StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  if (this->dataptr != (Publication **)0x0) {
    lVar5 = (long)this->bsize;
    if (0 < lVar5) {
      uVar6 = lVar5 + 1;
      lVar5 = lVar5 * 200;
      do {
        (*(code *)**(undefined8 **)
                    ((long)&this->dataptr[this->dataSlotIndex][-1].super_Interface._vptr_Interface +
                    lVar5))((long)&this->dataptr[this->dataSlotIndex][-1].super_Interface.
                                   _vptr_Interface + lVar5);
        uVar6 = uVar6 - 1;
        lVar5 = lVar5 + -200;
      } while (1 < uVar6);
    }
    iVar4 = this->dataSlotIndex;
    if (0 < (long)iVar4) {
      operator_delete(this->dataptr[iVar4],0x1900);
      iVar4 = this->dataSlotIndex;
      lVar5 = (long)iVar4;
      if (0 < lVar5) {
        do {
          lVar1 = lVar5 + -1;
          lVar3 = 0x1838;
          do {
            (*(code *)**(undefined8 **)
                        ((long)&(this->dataptr[lVar1]->super_Interface)._vptr_Interface + lVar3))
                      ((long)&(this->dataptr[lVar1]->super_Interface)._vptr_Interface + lVar3);
            lVar3 = lVar3 + -200;
          } while (lVar3 != -200);
          operator_delete(this->dataptr[lVar1],0x1900);
          bVar2 = 1 < lVar5;
          lVar5 = lVar1;
        } while (bVar2);
        iVar4 = this->dataSlotIndex;
      }
    }
    if (iVar4 == 0) {
      operator_delete(*this->dataptr,0x1900);
    }
    if (0 < this->freeIndex) {
      lVar5 = 0;
      do {
        operator_delete(this->freeblocks[lVar5],0x1900);
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->freeIndex);
    }
    if (this->freeblocks != (Publication **)0x0) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (Publication **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }